

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jtalk.c
# Opt level: O0

char16_t * openjtalk_getFullVoicePathU16(OpenJTalk *oj,char16_t *path,char16_t *buffer)

{
  size_t sVar1;
  char *pcVar2;
  char16_t *pcVar3;
  long in_RDX;
  char16_t *in_RSI;
  long in_RDI;
  char16_t *res2;
  char *temp2;
  char *res;
  char temp [260];
  char16_t *in_stack_fffffffffffffeb8;
  char16_t *in_stack_fffffffffffffec0;
  
  if (in_RDI == 0) {
    g_lastError = OPENJTALKERROR_OBJECT_POINTER_IS_NULL;
  }
  else {
    *(undefined4 *)(in_RDI + 0x678) = 0;
    if ((in_RSI != (char16_t *)0x0) && (sVar1 = strlenU16(in_RSI), sVar1 != 0)) {
      if (in_RDX == 0) {
        *(undefined4 *)(in_RDI + 0x678) = 0xc;
        return (char16_t *)0x0;
      }
      pcVar2 = u16tou8_path(in_stack_fffffffffffffec0,(char *)in_stack_fffffffffffffeb8);
      if (pcVar2 == (char *)0x0) {
        return (char16_t *)0x0;
      }
      pcVar2 = make_voice_path((OpenJTalk *)temp._232_8_,(char *)temp._224_8_);
      if (pcVar2 == (char *)0x0) {
        return (char16_t *)0x0;
      }
      pcVar3 = u8tou16_path((char *)in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8);
      free(pcVar2);
      return pcVar3;
    }
    *(undefined4 *)(in_RDI + 0x678) = 0xb;
  }
  return (char16_t *)0x0;
}

Assistant:

OPENJTALK_DLL_API char16_t *OPENJTALK_CONVENTION openjtalk_getFullVoicePathU16(OpenJTalk *oj, const char16_t *path, char16_t *buffer)
{
	if (!oj)
	{
		g_lastError = OPENJTALKERROR_OBJECT_POINTER_IS_NULL;
		return NULL;
	}

	oj->errorCode = OPENJTALKERROR_NO_ERROR;
	if (!path || strlenU16(path) == 0)
	{
		oj->errorCode = OPENJTALKERROR_PATH_STRING_IS_NULL_OR_EMPTY;
		return NULL;
	}

	if (!buffer)
	{
		oj->errorCode = OPENJTALKERROR_BUFFER_IS_NULL;
		return NULL;
	}

	char temp[MAX_PATH];
#if defined(_WIN32)
	char *res = u16tou8_path(path, temp);
#else
	char *res = u16tou8_path(path, temp);
#endif

	if (!res)
	{
		return NULL;
	}

	char *temp2 = make_voice_path(oj, temp);
	if (!temp2)
	{
		return NULL;
	}

#if defined(_WIN32)
	char16_t *res2 = u8tou16_path(temp2, buffer);
#else
	char16_t *res2 = u8tou16_path(temp2, buffer);
#endif
	free(temp2);
	return res2;
}